

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_scalar_hist1x4(uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint uVar1;
  int iVar2;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int k_1;
  int i_2;
  int k;
  int i_1;
  uint32_t i;
  uint32_t high [256];
  uint32_t low [256];
  int local_82c;
  uint local_828;
  int local_824;
  uint local_820;
  uint local_81c;
  int local_818 [256];
  int local_418 [256];
  long local_18;
  uint local_c;
  long local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_418,0,0x400);
  memset(local_818,0,0x400);
  for (local_81c = 0; local_81c < (local_c & 0xfffffffc); local_81c = local_81c + 4) {
    uVar1 = *(ushort *)(local_8 + (ulong)local_81c * 2) & 0xff;
    local_418[(int)uVar1] = local_418[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(ushort *)(local_8 + (ulong)local_81c * 2) >> 8;
    local_818[iVar2] = local_818[iVar2] + 1;
    uVar1 = *(ushort *)(local_8 + (ulong)(local_81c + 1) * 2) & 0xff;
    local_418[(int)uVar1] = local_418[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(ushort *)(local_8 + (ulong)(local_81c + 1) * 2) >> 8;
    local_818[iVar2] = local_818[iVar2] + 1;
    uVar1 = *(ushort *)(local_8 + (ulong)(local_81c + 2) * 2) & 0xff;
    local_418[(int)uVar1] = local_418[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(ushort *)(local_8 + (ulong)(local_81c + 2) * 2) >> 8;
    local_818[iVar2] = local_818[iVar2] + 1;
    uVar1 = *(ushort *)(local_8 + (ulong)(local_81c + 3) * 2) & 0xff;
    local_418[(int)uVar1] = local_418[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(ushort *)(local_8 + (ulong)(local_81c + 3) * 2) >> 8;
    local_818[iVar2] = local_818[iVar2] + 1;
  }
  while (local_81c < local_c) {
    uVar1 = *(ushort *)(local_8 + (ulong)local_81c * 2) & 0xff;
    local_418[(int)uVar1] = local_418[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(ushort *)(local_8 + (ulong)local_81c * 2) >> 8;
    local_818[iVar2] = local_818[iVar2] + 1;
    local_81c = local_81c + 1;
  }
  for (local_820 = 0; (int)local_820 < 0x100; local_820 = local_820 + 1) {
    for (local_824 = 0; local_824 < 8; local_824 = local_824 + 1) {
      *(int *)(local_18 + (long)local_824 * 4) =
           ((int)(local_820 & 1 << ((byte)local_824 & 0x1f)) >> ((byte)local_824 & 0x1f)) *
           local_418[(int)local_820] + *(int *)(local_18 + (long)local_824 * 4);
    }
  }
  for (local_828 = 0; (int)local_828 < 0x100; local_828 = local_828 + 1) {
    for (local_82c = 0; local_82c < 8; local_82c = local_82c + 1) {
      *(int *)(local_18 + (long)(local_82c + 8) * 4) =
           ((int)(local_828 & 1 << ((byte)local_82c & 0x1f)) >> ((byte)local_82c & 0x1f)) *
           local_818[(int)local_828] + *(int *)(local_18 + (long)(local_82c + 8) * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_hist1x4(const uint16_t* data, uint32_t len, uint32_t* flags) {
     uint32_t low[256] = {0}, high[256] = {0};

     uint32_t i = 0;
     for (i = 0; i < (len & ~3); i+=4) {
          ++low[data[i+0] & 255];
          ++high[(data[i+0] >> 8) & 255];
          ++low[data[i+1] & 255];
          ++high[(data[i+1] >> 8) & 255];
          ++low[data[i+2] & 255];
          ++high[(data[i+2] >> 8) & 255];
          ++low[data[i+3] & 255];
          ++high[(data[i+3] >> 8) & 255];
     }
     while (i < len) {
          ++low[data[i] & 255];
          ++high[(data[i++] >> 8) & 255];
     }

     for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k] += ((i & (1 << k)) >> k) * low[i];
        }
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k+8] += ((i & (1 << k)) >> k) * high[i];
        }
    }

    return 0;
}